

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

int * GetHashTable(BrotliEncoderState *s,int quality,size_t input_size,size_t *table_size)

{
  ulong uVar1;
  ulong uVar2;
  int *piVar3;
  ulong uVar4;
  
  uVar2 = 0x20000;
  if (quality == 0) {
    uVar2 = 0x8000;
  }
  if (input_size <= uVar2) {
    uVar2 = input_size;
  }
  uVar1 = 0x100;
  do {
    uVar4 = uVar1;
    uVar1 = uVar4 * 2;
  } while (uVar4 < uVar2);
  uVar2 = uVar4 * 2;
  if ((uVar4 & 0xaaa00) != 0) {
    uVar2 = uVar4;
  }
  if (quality != 0) {
    uVar2 = uVar4;
  }
  if (uVar2 < 0x401) {
    piVar3 = s->small_table_;
  }
  else if (s->large_table_size_ < uVar2) {
    s->large_table_size_ = uVar2;
    BrotliFree(&s->memory_manager_,s->large_table_);
    s->large_table_ = (int *)0x0;
    piVar3 = (int *)BrotliAllocate(&s->memory_manager_,uVar2 * 4);
    s->large_table_ = piVar3;
  }
  else {
    piVar3 = s->large_table_;
  }
  *table_size = uVar2;
  piVar3 = (int *)memset(piVar3,0,uVar2 << 2);
  return piVar3;
}

Assistant:

static int* GetHashTable(BrotliEncoderState* s, int quality,
                         size_t input_size, size_t* table_size) {
  /* Use smaller hash table when input.size() is smaller, since we
     fill the table, incurring O(hash table size) overhead for
     compression, and if the input is short, we won't need that
     many hash table entries anyway. */
  MemoryManager* m = &s->memory_manager_;
  const size_t max_table_size = MaxHashTableSize(quality);
  size_t htsize = HashTableSize(max_table_size, input_size);
  int* table;
  BROTLI_DCHECK(max_table_size >= 256);
  if (quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
    /* Only odd shifts are supported by fast-one-pass. */
    if ((htsize & 0xAAAAA) == 0) {
      htsize <<= 1;
    }
  }

  if (htsize <= sizeof(s->small_table_) / sizeof(s->small_table_[0])) {
    table = s->small_table_;
  } else {
    if (htsize > s->large_table_size_) {
      s->large_table_size_ = htsize;
      BROTLI_FREE(m, s->large_table_);
      s->large_table_ = BROTLI_ALLOC(m, int, htsize);
      if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(s->large_table_)) return 0;
    }
    table = s->large_table_;
  }

  *table_size = htsize;
  memset(table, 0, htsize * sizeof(*table));
  return table;
}